

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O2

void emit_code(FILE *out,rule *rp,lemon *lemp,int *lineno)

{
  char *pcVar1;
  int iVar2;
  
  if ((rp->codePrefix != (char *)0x0) && (*rp->codePrefix != '\0')) {
    fprintf((FILE *)out,"{%s");
    pcVar1 = rp->codePrefix;
    do {
      if (*pcVar1 == '\n') {
        *lineno = *lineno + 1;
      }
      else if (*pcVar1 == '\0') break;
      pcVar1 = pcVar1 + 1;
    } while( true );
  }
  pcVar1 = rp->code;
  if (pcVar1 != (char *)0x0) {
    if (lemp->nolinenosflag == 0) {
      *lineno = *lineno + 1;
      tplt_linedir(out,rp->line,lemp->filename);
      pcVar1 = rp->code;
    }
    fprintf((FILE *)out,"{%s",pcVar1);
    pcVar1 = rp->code;
    do {
      if (*pcVar1 == '\n') {
        *lineno = *lineno + 1;
      }
      else if (*pcVar1 == '\0') goto LAB_0010ae92;
      pcVar1 = pcVar1 + 1;
    } while( true );
  }
LAB_0010aece:
  pcVar1 = rp->codeSuffix;
  if ((pcVar1 != (char *)0x0) && (*pcVar1 != '\0')) {
    fputs(pcVar1,(FILE *)out);
    pcVar1 = rp->codeSuffix;
    do {
      if (*pcVar1 == '\n') {
        *lineno = *lineno + 1;
      }
      else if (*pcVar1 == '\0') break;
      pcVar1 = pcVar1 + 1;
    } while( true );
  }
  if (rp->codePrefix != (char *)0x0) {
    fwrite("}\n",2,1,(FILE *)out);
    *lineno = *lineno + 1;
  }
  return;
LAB_0010ae92:
  fwrite("}\n",2,1,(FILE *)out);
  iVar2 = *lineno;
  *lineno = iVar2 + 1;
  if (lemp->nolinenosflag == 0) {
    iVar2 = iVar2 + 2;
    *lineno = iVar2;
    tplt_linedir(out,iVar2,lemp->outname);
  }
  goto LAB_0010aece;
}

Assistant:

PRIVATE void emit_code(
  FILE *out,
  struct rule *rp,
  struct lemon *lemp,
  int *lineno
){
 const char *cp;

 /* Setup code prior to the #line directive */
 if( rp->codePrefix && rp->codePrefix[0] ){
   fprintf(out, "{%s", rp->codePrefix);
   for(cp=rp->codePrefix; *cp; cp++){ if( *cp=='\n' ) (*lineno)++; }
 }

 /* Generate code to do the reduce action */
 if( rp->code ){
   if( !lemp->nolinenosflag ){
     (*lineno)++;
     tplt_linedir(out,rp->line,lemp->filename);
   }
   fprintf(out,"{%s",rp->code);
   for(cp=rp->code; *cp; cp++){ if( *cp=='\n' ) (*lineno)++; }
   fprintf(out,"}\n"); (*lineno)++;
   if( !lemp->nolinenosflag ){
     (*lineno)++;
     tplt_linedir(out,*lineno,lemp->outname);
   }
 }

 /* Generate breakdown code that occurs after the #line directive */
 if( rp->codeSuffix && rp->codeSuffix[0] ){
   fprintf(out, "%s", rp->codeSuffix);
   for(cp=rp->codeSuffix; *cp; cp++){ if( *cp=='\n' ) (*lineno)++; }
 }

 if( rp->codePrefix ){
   fprintf(out, "}\n"); (*lineno)++;
 }

 return;
}